

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O2

Nwk_Obj_t * Nwk_ManCreateCo(Nwk_Man_t *p)

{
  Nwk_Obj_t *Entry;
  
  Entry = Nwk_ManCreateObj(p,1,1);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0x7f | p->vCos->nSize << 7;
  Vec_PtrPush(p->vCos,Entry);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff8 | 2;
  p->nObjs[2] = p->nObjs[2] + 1;
  return Entry;
}

Assistant:

Nwk_Obj_t * Nwk_ManCreateCo( Nwk_Man_t * p )
{
    Nwk_Obj_t * pObj;
    pObj = Nwk_ManCreateObj( p, 1, 1 );
    pObj->PioId = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = NWK_OBJ_CO;
    p->nObjs[NWK_OBJ_CO]++;
    return pObj;
}